

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O2

void __thiscall DataRefs::SetViewType(DataRefs *this,XPViewTypes vt)

{
  long lVar1;
  long lVar2;
  
  lVar1 = 0;
  do {
    lVar2 = lVar1;
    if (lVar2 == 0x60) {
      if ((int)dataRefs.iLogLevel < 3) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/DataRefs.cpp"
               ,0x46d,"SetViewType",logWARN,"Didn\'t find the requested view type %d");
        return;
      }
      return;
    }
    lVar1 = lVar2 + 8;
  } while (*(XPViewTypes *)((long)&MAP_VIEW_TYPES[0].e + lVar2) != vt);
  XPLMCommandOnce(this->cmdXP[*(int *)((long)&MAP_VIEW_TYPES[0].cr + lVar2)]);
  return;
}

Assistant:

void DataRefs::SetViewType(XPViewTypes vt)
{
    // search the view in the map of view types
    for (const mapViewTypesTy& mvt: MAP_VIEW_TYPES)
        if (mvt.e == vt) {
            XPLMCommandOnce(cmdXP[mvt.cr]);
            return;
        }
    LOG_MSG(logWARN, "Didn't find the requested view type %d", int(vt));
}